

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O0

void VW::move_feature_namespace(example *dst,example *src,namespace_index c)

{
  uchar *__val;
  uchar **ppuVar1;
  v_array<unsigned_char> *this;
  long lVar2;
  long lVar3;
  size_t sVar4;
  byte in_DL;
  v_array<unsigned_char> *in_RSI;
  v_array<unsigned_char> *in_RDI;
  features *in_stack_00000018;
  features *fsrc;
  features *fdst;
  uchar *new_ele;
  uchar *in_stack_ffffffffffffffd0;
  uchar *in_stack_ffffffffffffffd8;
  uchar *in_stack_ffffffffffffffe0;
  
  v_array<unsigned_char>::begin(in_RSI);
  v_array<unsigned_char>::end(in_RSI);
  __val = std::find<unsigned_char*,unsigned_char>
                    (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  ppuVar1 = v_array<unsigned_char>::end(in_RSI);
  if (__val != *ppuVar1) {
    ppuVar1 = v_array<unsigned_char>::begin(in_RDI);
    new_ele = *ppuVar1;
    v_array<unsigned_char>::end(in_RDI);
    this = (v_array<unsigned_char> *)
           std::find<unsigned_char*,unsigned_char>
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__val);
    ppuVar1 = v_array<unsigned_char>::end(in_RDI);
    if (this == (v_array<unsigned_char> *)*ppuVar1) {
      v_array<unsigned_char>::push_back(this,new_ele);
    }
    lVar2 = (long)in_RDI + (ulong)in_DL * 0x68 + 0x20;
    lVar3 = (long)in_RSI + (ulong)in_DL * 0x68 + 0x20;
    sVar4 = features::size((features *)0x25bc18);
    in_RSI[0x345]._begin = in_RSI[0x345]._begin + -sVar4;
    *(float *)((long)&in_RSI[0x345].end_array + 4) =
         *(float *)((long)&in_RSI[0x345].end_array + 4) - *(float *)(lVar3 + 0x60);
    std::swap<features>(fsrc,in_stack_00000018);
    sVar4 = features::size((features *)0x25bc6d);
    in_RDI[0x345]._begin = in_RDI[0x345]._begin + sVar4;
    *(float *)((long)&in_RDI[0x345].end_array + 4) =
         *(float *)(lVar2 + 0x60) + *(float *)((long)&in_RDI[0x345].end_array + 4);
  }
  return;
}

Assistant:

void move_feature_namespace(example* dst, example* src, namespace_index c)
{
  if (std::find(src->indices.begin(), src->indices.end(), c) == src->indices.end())
    return;  // index not present in src
  if (std::find(dst->indices.begin(), dst->indices.end(), c) == dst->indices.end())
    dst->indices.push_back(c);

  auto& fdst = dst->feature_space[c];
  auto& fsrc = src->feature_space[c];

  src->num_features -= fsrc.size();
  src->total_sum_feat_sq -= fsrc.sum_feat_sq;
  std::swap(fdst, fsrc);
  dst->num_features += fdst.size();
  dst->total_sum_feat_sq += fdst.sum_feat_sq;
}